

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O3

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::consistency_model)0>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,16ul,8ul>
          (Allocation *__return_storage_ptr__,void *this)

{
  LfQueueControl *pLVar1;
  LfQueueControl *i_tail;
  ulong uVar2;
  void *page;
  bool bVar3;
  
  pLVar1 = *this;
  do {
    while( true ) {
      i_tail = pLVar1;
      if (i_tail == (LfQueueControl *)0x0 || ((ulong)i_tail & 0x3f) != 0) {
        density_tests::detail::assert_failed<>
                  ("tail != 0 && uint_is_aligned(tail, s_alloc_granularity)",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                   ,0xf7);
      }
      uVar2 = (ulong)((long)&i_tail[0xc].m_next + 7U) & 0xffffffffffffffc0;
      if (uVar2 - ((ulong)i_tail & 0xffffffffffff0000) < 0xffc1) break;
      pLVar1 = (LfQueueControl *)
               LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
               ::page_overflow((LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                                *)this,LfQueue_Throwing,(uintptr_t)i_tail);
    }
    LOCK();
    pLVar1 = *this;
    bVar3 = i_tail == pLVar1;
    if (bVar3) {
      *(ulong *)this = uVar2;
      pLVar1 = i_tail;
    }
    UNLOCK();
  } while (!bVar3);
  if (i_tail->m_next != 0) {
    density_tests::detail::assert_failed<>
              ("raw_atomic_load(&new_block->m_next, mem_relaxed) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x11c);
  }
  LOCK();
  i_tail->m_next = uVar2 | 1;
  UNLOCK();
  if ((LfQueueControl *)((ulong)i_tail & 0xffffffffffff0000 | 0xffc0) <= i_tail) {
    density_tests::detail::assert_failed<>
              ("new_block < get_end_control_block(new_block)",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x121);
  }
  __return_storage_ptr__->m_control_block = i_tail;
  __return_storage_ptr__->m_next_ptr = uVar2 | 1;
  __return_storage_ptr__->m_user_storage = i_tail + 3;
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl() noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                static_assert(
                  (CONTROL_BITS & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0,
                  "internal error");
                static_assert(
                  is_power_of_2(ALIGNMENT) && (SIZE % ALIGNMENT) == 0, "internal error");

                constexpr size_t alignment = size_max(ALIGNMENT, min_alignment);
                constexpr size_t size      = uint_upper_align(SIZE, alignment);
                constexpr bool   can_fit_in_a_page =
                  size + (alignment - min_alignment) <= s_max_size_inpage;
                constexpr bool over_aligned = alignment > min_alignment;

                /* Operations on m_tail are mostly relaxed, because the ordering is done when accessing
                the member m_next of the control blocks. */
                uintptr_t tail = m_tail.load(mem_relaxed);
                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      tail != 0 && uint_is_aligned(tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    uintptr_t new_tail =
                      tail + (INCLUDE_TYPE ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate the user space
                    if (over_aligned)
                        new_tail = uint_upper_align(new_tail, alignment);
                    DENSITY_ASSUME_UINT_ALIGNED(new_tail, alignment);
                    void * const user_storage = reinterpret_cast<void *>(new_tail);
                    new_tail = uint_upper_align(new_tail + SIZE, s_alloc_granularity);

                    // check for page overflow
                    uintptr_t const page_start =
                      uint_lower_align(tail, ALLOCATOR_TYPE::page_alignment);
                    DENSITY_ASSUME(new_tail > page_start);
                    uintptr_t const new_tail_offset = new_tail - page_start;
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* No page overflow occurs with the new tail we have computed. */
                        if (m_tail.compare_exchange_weak(tail, new_tail, mem_relaxed, mem_relaxed))
                        {
                            /* At this point this thread has truncated the queue, because it has allocated
                            an element, but the member m_next of its control point is still zeroed (the
                            initial content of a newly allocated page).
                            Other threads may still put elements, but they will be not visible to the consumers
                            until the next store is completed. This is one of the reasons why this class
                            is not sequential consistent.

                            The next store is safe because the zeroed block is a barrier that consumers will
                            not get over, so this page can't be deallocated. If this block does not have the
                            dead 'flag', the access to this page is safe until the element is committed or canceled. */

                            // initialize the control block
                            auto const new_block = reinterpret_cast<ControlBlock *>(tail);
                            DENSITY_ASSERT_INTERNAL(
                              raw_atomic_load(&new_block->m_next, mem_relaxed) == 0);
                            uintptr_t const next_ptr = new_tail + CONTROL_BITS;
                            raw_atomic_store(&new_block->m_next, next_ptr, mem_relaxed);

                            // successful
                            DENSITY_ASSERT_INTERNAL(new_block < get_end_control_block(new_block));
                            return {new_block, next_ptr, user_storage};
                        }
                        else
                        {
                            if (guarantee == LfQueue_WaitFree)
                            {
                                // don't retry
                                return Allocation{};
                            }
                        }
                    }
                    else if (can_fit_in_a_page) // if this allocation may fit in a page
                    {
                        tail = page_overflow(guarantee, tail);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (tail == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            DENSITY_ASSUME(tail != 0);
                        }
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          CONTROL_BITS, SIZE, ALIGNMENT);
                    }
                }
            }